

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionArgument.cpp
# Opt level: O2

FunctionArgument * __thiscall
ninx::parser::element::FunctionArgument::clone_impl(FunctionArgument *this)

{
  FunctionArgument *this_00;
  pointer *__ptr;
  __uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  local_28;
  _Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
  local_20;
  
  if ((this->default_value)._M_t.
      super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
      ._M_t.
      super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
      .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl ==
      (Expression *)0x0) {
    local_28._M_t.
    super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
    .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl =
         (tuple<ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
          )(_Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
            )0x0;
  }
  else {
    ASTElement::clone<ninx::parser::element::Expression>((ASTElement *)&local_20);
    local_28._M_t.
    super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
    .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl =
         (tuple<ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
          )(tuple<ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
            )local_20.super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl
    ;
  }
  this_00 = (FunctionArgument *)operator_new(0x40);
  FunctionArgument(this_00,&this->name,
                   (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                    *)&local_28);
  if ((_Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
       )local_28._M_t.
        super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
        .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl !=
      (Expression *)0x0) {
    (**(code **)(*(long *)local_28._M_t.
                          super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
                          .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>.
                          _M_head_impl + 8))();
  }
  return this_00;
}

Assistant:

ninx::parser::element::FunctionArgument *ninx::parser::element::FunctionArgument::clone_impl() {
    std::unique_ptr<Expression> default_value_copy {nullptr};
    if (this->default_value) {
        default_value_copy = this->default_value->clone<Expression>();
    }

    return new FunctionArgument(this->name, std::move(default_value_copy));
}